

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *__s;
  symbol **ppsVar4;
  symbol *psVar5;
  symbol *psVar6;
  ushort *puVar7;
  undefined8 *puVar8;
  FILE *__nmemb;
  int iVar9;
  uint uVar10;
  void *__ptr;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  ushort **ppuVar14;
  void *pvVar15;
  char cVar16;
  byte *pbVar17;
  long lVar18;
  char *pcVar19;
  int iVar20;
  ulong uVar21;
  char *pcVar22;
  FILE *__stream;
  ulong uVar23;
  long lVar24;
  long lVar25;
  byte *pbVar26;
  uint local_58;
  
  iVar3 = lemp->nsymbol;
  lVar24 = (long)iVar3;
  __nmemb = (FILE *)(lVar24 * 2);
  pcVar22 = (char *)0x8;
  __stream = __nmemb;
  __ptr = calloc((size_t)__nmemb,8);
  if (__ptr == (void *)0x0) {
LAB_0010bce5:
    print_stack_union_cold_3();
  }
  else {
    __s = (byte *)lemp->vartype;
    if (__s == (byte *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = strlen((char *)__s);
    }
    iVar9 = (int)sVar11;
    if (0 < iVar3) {
      ppsVar4 = lemp->symbols;
      lVar25 = 0;
      do {
        pcVar13 = ppsVar4[lVar25]->datatype;
        if (pcVar13 != (char *)0x0) {
          sVar12 = strlen(pcVar13);
          uVar10 = (uint)sVar12;
          if ((int)(uint)sVar12 < (int)(uint)sVar11) {
            uVar10 = (uint)sVar11;
          }
          sVar11 = (size_t)uVar10;
        }
        iVar9 = (int)sVar11;
        lVar25 = lVar25 + 1;
      } while (lVar24 != lVar25);
    }
    __stream = (FILE *)(long)(iVar9 * 2 + 1);
    pcVar13 = (char *)malloc((size_t)__stream);
    if (pcVar13 != (char *)0x0) {
      local_58 = (uint)__nmemb;
      if (0 < iVar3) {
        ppsVar4 = lemp->symbols;
        psVar5 = lemp->errsym;
        lVar25 = 0;
        do {
          psVar6 = ppsVar4[lVar25];
          uVar10 = local_58 | 1;
          if (((psVar6 == psVar5) || (uVar10 = 0, psVar6->type != NONTERMINAL)) ||
             (pbVar26 = (byte *)psVar6->datatype, __s == (byte *)0x0 && pbVar26 == (byte *)0x0)) {
LAB_0010bb12:
            psVar6->dtnum = uVar10;
          }
          else {
            if (pbVar26 == (byte *)0x0) {
              pbVar26 = __s;
            }
            ppuVar14 = __ctype_b_loc();
            puVar7 = *ppuVar14;
            pbVar17 = pbVar26 + -1;
            do {
              pbVar26 = pbVar26 + 1;
              pbVar1 = pbVar17 + 1;
              uVar23 = (ulong)*pbVar1;
              pbVar17 = pbVar17 + 1;
            } while ((*(byte *)((long)puVar7 + uVar23 * 2 + 1) & 0x20) != 0);
            iVar9 = 0;
            if (*pbVar1 != 0) {
              uVar21 = 0;
              do {
                pcVar13[uVar21] = (char)uVar23;
                uVar21 = uVar21 + 1;
                bVar2 = *pbVar26;
                uVar23 = (ulong)bVar2;
                pbVar26 = pbVar26 + 1;
              } while (bVar2 != 0);
              if ((int)uVar21 < 1) {
LAB_0010ba11:
                iVar9 = (int)uVar21;
              }
              else {
                do {
                  iVar20 = (int)uVar21;
                  if ((*(byte *)((long)puVar7 +
                                (ulong)(byte)pcVar13[(uVar21 & 0xffffffff) - 1] * 2 + 1) & 0x20) ==
                      0) goto LAB_0010ba11;
                  uVar21 = (ulong)(iVar20 - 1);
                } while (1 < iVar20);
              }
            }
            pcVar13[iVar9] = '\0';
            pcVar22 = lemp->tokentype;
            if ((pcVar22 != (char *)0x0) && (iVar9 = strcmp(pcVar13,pcVar22), iVar9 == 0)) {
              uVar10 = 0;
              goto LAB_0010bb12;
            }
            cVar16 = *pcVar13;
            uVar10 = 0;
            pcVar19 = pcVar13;
            if (cVar16 != '\0') {
              do {
                pcVar22 = (char *)(ulong)(uVar10 * 0x35);
                uVar10 = (int)cVar16 + uVar10 * 0x35;
                cVar16 = pcVar19[1];
                pcVar19 = pcVar19 + 1;
              } while (cVar16 != '\0');
              uVar10 = uVar10 & 0x7fffffff;
            }
            uVar23 = (ulong)uVar10 % ((ulong)__nmemb & 0xffffffff);
            while( true ) {
              pcVar19 = *(char **)((long)__ptr + uVar23 * 8);
              if (pcVar19 == (char *)0x0) break;
              pcVar22 = pcVar13;
              iVar9 = strcmp(pcVar19,pcVar13);
              uVar10 = (int)uVar23 + 1;
              if (iVar9 == 0) goto LAB_0010bb12;
              if (local_58 <= uVar10) {
                uVar10 = 0;
              }
              uVar23 = (ulong)uVar10;
            }
            psVar6->dtnum = (int)uVar23 + 1;
            sVar11 = strlen(pcVar13);
            __stream = (FILE *)(long)((int)sVar11 + 1);
            pvVar15 = malloc((size_t)__stream);
            *(void **)((long)__ptr + uVar23 * 8) = pvVar15;
            if (pvVar15 == (void *)0x0) {
              print_stack_union_cold_1();
              goto LAB_0010bce5;
            }
            lVar18 = 0;
            do {
              cVar16 = pcVar13[lVar18];
              *(char *)((long)pvVar15 + lVar18) = cVar16;
              lVar18 = lVar18 + 1;
            } while (cVar16 != '\0');
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != lVar24);
      }
      pcVar22 = "Parse";
      if (lemp->name != (char *)0x0) {
        pcVar22 = lemp->name;
      }
      iVar9 = *plineno;
      if (mhflag != 0) {
        fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
        iVar9 = iVar9 + 1;
      }
      pcVar19 = "void*";
      if (lemp->tokentype != (char *)0x0) {
        pcVar19 = lemp->tokentype;
      }
      fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar22,pcVar19);
      if (mhflag == 0) {
        iVar9 = iVar9 + 1;
      }
      else {
        fwrite("#endif\n",7,1,(FILE *)out);
        iVar9 = iVar9 + 2;
      }
      fwrite("typedef union {\n",0x10,1,(FILE *)out);
      fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
      fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar22);
      iVar9 = iVar9 + 3;
      if (0 < iVar3) {
        uVar23 = 0;
        do {
          pvVar15 = *(void **)((long)__ptr + uVar23 * 8);
          if (pvVar15 != (void *)0x0) {
            fprintf((FILE *)out,"  %s yy%d;\n",pvVar15,(ulong)((int)uVar23 + 1));
            iVar9 = iVar9 + 1;
            free(pvVar15);
          }
          uVar23 = uVar23 + 1;
        } while (((ulong)__nmemb & 0xffffffff) != uVar23);
      }
      psVar5 = lemp->errsym;
      if ((psVar5 != (symbol *)0x0) && (psVar5->useCnt != 0)) {
        fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)psVar5->dtnum);
        iVar9 = iVar9 + 1;
      }
      free(pcVar13);
      free(__ptr);
      fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
      *plineno = iVar9 + 1;
      return;
    }
  }
  print_stack_union_cold_2();
  fprintf(__stream,"%s ::=",**(undefined8 **)pcVar22);
  if (0 < *(int *)(pcVar22 + 0x18)) {
    lVar24 = 0;
    do {
      puVar8 = *(undefined8 **)(*(long *)(pcVar22 + 0x20) + lVar24 * 8);
      if (*(int *)((long)puVar8 + 0xc) == 2) {
        fprintf(__stream," %s",**(undefined8 **)puVar8[0xc]);
        if (1 < *(int *)(puVar8 + 0xb)) {
          lVar25 = 1;
          do {
            fprintf(__stream,"|%s",**(undefined8 **)(puVar8[0xc] + lVar25 * 8));
            lVar25 = lVar25 + 1;
          } while (lVar25 < *(int *)(puVar8 + 0xb));
        }
      }
      else {
        fprintf(__stream," %s",*puVar8);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < *(int *)(pcVar22 + 0x18));
  }
  return;
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = *plineno;    /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      lemon_strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}